

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O0

cram_encoding cram_stats_encoding(cram_fd *fd,cram_stats *st)

{
  khint32_t kVar1;
  int local_78;
  int local_74;
  uint local_6c;
  int i_1;
  khint_t k_1;
  int *codes;
  void *pvStack_58;
  int vals_alloc;
  int *freqs;
  int *vals;
  khint32_t local_40;
  int k;
  int min_val;
  int max_val;
  int ntot;
  int i;
  int nvals;
  int bits;
  int best_size;
  cram_encoding best_encoding;
  cram_stats *st_local;
  cram_fd *fd_local;
  
  min_val = 0;
  k = 0;
  local_40 = 0x7fffffff;
  freqs = (int *)0x0;
  pvStack_58 = (void *)0x0;
  codes._4_4_ = 0;
  ntot = 0;
  for (max_val = 0; max_val < 0x400; max_val = max_val + 1) {
    if (st->freqs[max_val] != 0) {
      if (codes._4_4_ <= ntot) {
        if (codes._4_4_ == 0) {
          local_74 = 0x400;
        }
        else {
          local_74 = codes._4_4_ << 1;
        }
        codes._4_4_ = local_74;
        freqs = (int *)realloc(freqs,(long)local_74 << 2);
        pvStack_58 = realloc(pvStack_58,(long)local_74 << 2);
        if ((freqs == (int *)0x0) || (pvStack_58 == (void *)0x0)) {
          if (freqs != (int *)0x0) {
            free(freqs);
          }
          if (pvStack_58 != (void *)0x0) {
            free(pvStack_58);
          }
          return E_HUFFMAN;
        }
      }
      freqs[ntot] = max_val;
      *(int *)((long)pvStack_58 + (long)ntot * 4) = st->freqs[max_val];
      min_val = *(int *)((long)pvStack_58 + (long)ntot * 4) + min_val;
      if (k < max_val) {
        k = max_val;
      }
      if (max_val < (int)local_40) {
        local_40 = max_val;
      }
      ntot = ntot + 1;
    }
  }
  if (st->h != (kh_m_i2i_t *)0x0) {
    for (local_6c = 0; local_6c != st->h->n_buckets; local_6c = local_6c + 1) {
      if ((st->h->flags[local_6c >> 4] >> (sbyte)((local_6c & 0xf) << 1) & 3) == 0) {
        if (codes._4_4_ <= ntot) {
          if (codes._4_4_ == 0) {
            local_78 = 0x400;
          }
          else {
            local_78 = codes._4_4_ << 1;
          }
          codes._4_4_ = local_78;
          freqs = (int *)realloc(freqs,(long)local_78 << 2);
          pvStack_58 = realloc(pvStack_58,(long)local_78 << 2);
          if ((freqs == (int *)0x0) || (pvStack_58 == (void *)0x0)) {
            return E_HUFFMAN;
          }
        }
        kVar1 = st->h->keys[local_6c];
        freqs[ntot] = kVar1;
        *(int *)((long)pvStack_58 + (long)ntot * 4) = st->h->vals[local_6c];
        min_val = *(int *)((long)pvStack_58 + (long)ntot * 4) + min_val;
        if (k < (int)kVar1) {
          k = kVar1;
        }
        if ((int)kVar1 < (int)local_40) {
          local_40 = kVar1;
        }
        ntot = ntot + 1;
      }
    }
  }
  st->nvals = ntot;
  if (min_val == st->nsamp) {
    if (ntot < 2) {
      free(freqs);
      free(pvStack_58);
      fd_local._4_4_ = E_HUFFMAN;
    }
    else {
      if (1 < fd->verbose) {
        fprintf(_stderr,"Range = %d..%d, nvals=%d, ntot=%d\n",(ulong)local_40,(ulong)(uint)k,
                (ulong)(uint)ntot,(ulong)(uint)min_val);
      }
      if ((ntot < 2) || (min_val < 0x101)) {
        free(freqs);
        free(pvStack_58);
        fd_local._4_4_ = E_BETA;
        if (ntot < 200) {
          fd_local._4_4_ = E_HUFFMAN;
        }
      }
      else {
        free(freqs);
        free(pvStack_58);
        fd_local._4_4_ = E_EXTERNAL;
      }
    }
    return fd_local._4_4_;
  }
  __assert_fail("ntot == st->nsamp",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_stats.c"
                ,0xcc,"enum cram_encoding cram_stats_encoding(cram_fd *, cram_stats *)");
}

Assistant:

enum cram_encoding cram_stats_encoding(cram_fd *fd, cram_stats *st) {
    enum cram_encoding best_encoding = E_NULL;
    int best_size = INT_MAX, bits;
    int nvals, i, ntot = 0, max_val = 0, min_val = INT_MAX, k;
    int *vals = NULL, *freqs = NULL, vals_alloc = 0, *codes;

    //cram_stats_dump(st);

    /* Count number of unique symbols */
    for (nvals = i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	if (nvals >= vals_alloc) {
	    vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
	    vals  = realloc(vals,  vals_alloc * sizeof(int));
	    freqs = realloc(freqs, vals_alloc * sizeof(int));
	    if (!vals || !freqs) {
		if (vals)  free(vals);
		if (freqs) free(freqs);
		return E_HUFFMAN; // Cannot do much else atm
	    }
	}
	vals[nvals] = i;
	freqs[nvals] = st->freqs[i];
	ntot += freqs[nvals];
	if (max_val < i) max_val = i;
	if (min_val > i) min_val = i;
	nvals++;
    }
    if (st->h) {
	khint_t k;
	int i;

	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;

	    if (nvals >= vals_alloc) {
		vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
		vals  = realloc(vals,  vals_alloc * sizeof(int));
		freqs = realloc(freqs, vals_alloc * sizeof(int));
		if (!vals || !freqs)
		    return E_HUFFMAN; // Cannot do much else atm
	    }
	    i = kh_key(st->h, k);
	    vals[nvals]=i;
	    freqs[nvals] = kh_val(st->h, k);
	    ntot += freqs[nvals];
	    if (max_val < i) max_val = i;
	    if (min_val > i) min_val = i;
	    nvals++;
	}
    }

    st->nvals = nvals;
    assert(ntot == st->nsamp);

    if (nvals <= 1) {
	free(vals);
	free(freqs);
	return E_HUFFMAN;
    }

    if (fd->verbose > 1)
	fprintf(stderr, "Range = %d..%d, nvals=%d, ntot=%d\n",
		min_val, max_val, nvals, ntot);

    /* Theoretical entropy */
//    if (fd->verbose > 1) {
//	double dbits = 0;
//	for (i = 0; i < nvals; i++) {
//	    dbits += freqs[i] * log((double)freqs[i]/ntot);
//	}
//	dbits /= -log(2);
//	if (fd->verbose > 1)
//	    fprintf(stderr, "Entropy = %f\n", dbits);
//    }

    if (nvals > 1 && ntot > 256) {
#if 0
	/*
	 * CRUDE huffman estimator. Round to closest and round up from 0
	 * to 1 bit.
	 *
	 * With and without ITF8 incase we have a few discrete values but with
	 * large magnitude.
	 *
	 * Note rans0/arith0 and Z_HUFFMAN_ONLY vs internal huffman can be
	 * compared in this way, but order-1 (eg rans1) or maybe LZ77 modes
	 * may detect the correlation of high bytes to low bytes in multi-
	 * byte values. So this predictor breaks down.
	 */
	double dbits = 0;  // entropy + ~huffman
	double dbitsH = 0;
	double dbitsE = 0; // external entropy + ~huffman
	double dbitsEH = 0;
	int F[256] = {0}, n = 0;
	double e = 0; // accumulated error bits
	for (i = 0; i < nvals; i++) {
	    double x; int X;
	    unsigned int v = vals[i];

	    //Better encoding would cope with sign.
	    //v = ABS(vals[i])*2+(vals[i]<0);

	    if (!(v & ~0x7f)) {
		F[v]             += freqs[i], n+=freqs[i];
	    } else if (!(v & ~0x3fff)) {
		F[(v>>8) |0x80] += freqs[i];
		F[ v     &0xff] += freqs[i], n+=2*freqs[i];
	    } else if (!(v & ~0x1fffff)) {
		F[(v>>16)|0xc0] += freqs[i];
		F[(v>>8 )&0xff] += freqs[i];
		F[ v     &0xff] += freqs[i], n+=3*freqs[i];
	    } else if (!(v & ~0x0fffffff)) {
		F[(v>>24)|0xe0] += freqs[i];
		F[(v>>16)&0xff] += freqs[i];
		F[(v>>8 )&0xff] += freqs[i];
		F[ v     &0xff] += freqs[i], n+=4*freqs[i];
	    } else {
		F[(v>>28)|0xf0] += freqs[i];
		F[(v>>20)&0xff] += freqs[i];
		F[(v>>12)&0xff] += freqs[i];
		F[(v>>4 )&0xff] += freqs[i];
		F[ v     &0x0f] += freqs[i], n+=5*freqs[i];
	    }

	    x = -log((double)freqs[i]/ntot)/.69314718055994530941;
	    X = x+0.5;
	    if ((int)(x+((double)e/freqs[i])+.5)>X) {
		X++;
	    } else if ((int)(x+((double)e/freqs[i])+.5)<X) {
		X--;
	    }
	    e-=freqs[i]*(X-x);
	    X += (X==0);

	    //fprintf(stderr, "Val %d = %d x %d (ent %f, %d) e %f\n", i, v, freqs[i], x, X, e);

	    dbits  += freqs[i] * x;
	    dbitsH += freqs[i] * X;
	}

	for (i = 0; i < 256; i++) {
	    if (F[i]) {
		double x = -log((double)F[i]/n)/.69314718055994530941;
		int X = x+0.5;
		X += (X==0);
		dbitsE  += F[i] * x;
		dbitsEH += F[i] * X;

		//fprintf(stderr, "Val %d = %d x %d (e %f, %d)\n", i, i, F[i], x, X);
	    }
	}

	//fprintf(stderr, "CORE Entropy = %f, %f\n", dbits/8, dbitsH/8);
	//fprintf(stderr, "Ext. Entropy = %f, %f\n", dbitsE/8, dbitsEH/8);

	if (dbitsE < 1000 || dbitsE / dbits > 1.1) {
	    //fprintf(stderr, "=> %d < 200 ? E_HUFFMAN : E_BETA\n", nvals);
	    free(vals); free(freqs);
	    return nvals < 200 ? E_HUFFMAN : E_BETA;
	}
#endif
	free(vals); free(freqs);
	return E_EXTERNAL;
    }

    /*
     * Avoid complex stats for now, just do heuristic of HUFFMAN for small
     * alphabets and BETA for anything large.
     */
    free(vals); free(freqs);
    return nvals < 200 ? E_HUFFMAN : E_BETA;
    //return E_HUFFMAN;
    //return E_EXTERNAL;


    /* We only support huffman now anyway... */
    //free(vals); free(freqs); return E_HUFFMAN;

    /* Beta */
    bits = nbits(max_val - min_val) * ntot;
    if (fd->verbose > 1)
	fprintf(stderr, "BETA    = %d\n", bits);
    if (best_size > bits)
	best_size = bits, best_encoding = E_BETA;

#if 0
    /* Unary */
    if (min_val >= 0) {
	for (bits = i = 0; i < nvals; i++)
	    bits += freqs[i]*(vals[i]+1);
	if (fd->verbose > 1)
	    fprintf(stderr, "UNARY   = %d\n", bits);
	if (best_size > bits)
	    best_size = bits, best_encoding = E_NULL; //E_UNARY;
    }

    /* Gamma */
    for (bits = i = 0; i < nvals; i++)
	bits += ((nbits(vals[i]-min_val+1)-1) + nbits(vals[i]-min_val+1)) * freqs[i];
    if (fd->verbose > 1)
	fprintf(stderr, "GAMMA   = %d\n", bits);
    if (best_size > bits)
	best_size = bits, best_encoding = E_GAMMA;

    /* Subexponential */
    for (k = 0; k < 10; k++) {
	for (bits = i = 0; i < nvals; i++) {
	    if (vals[i]-min_val < (1<<k))
		bits += (1 + k)*freqs[i];
	    else
		bits += (nbits(vals[i]-min_val)*2-k)*freqs[i];
	}

	if (fd->verbose > 1)
	    fprintf(stderr, "SUBEXP%d = %d\n", k, bits);
	if (best_size > bits)
	    best_size = bits, best_encoding = E_SUBEXP;
    }
#endif

    /* byte array len */

    /* byte array stop */

    /* External? Guesswork! */

    /* Huffman */
//    qsort(freqs, nvals, sizeof(freqs[0]), sort_freqs);
//    for (i = 0; i < nvals; i++) {
//	fprintf(stderr, "%d = %d\n", i, freqs[i]);
//	vals[i] = 0;
//    }

    /* Grow freqs to 2*freqs, to store sums */
    /* Vals holds link data */
    freqs = realloc(freqs, 2*nvals*sizeof(*freqs));
    codes = calloc(2*nvals, sizeof(*codes));
    if (!freqs || !codes)
	return E_HUFFMAN; // Cannot do much else atm

    /* Inefficient, use pointers to form chain so we can insert and maintain
     * a sorted list? This is currently O(nvals^2) complexity.
     */
    for (;;) {
	int low1 = INT_MAX, low2 = INT_MAX;
	int ind1 = 0, ind2 = 0;
	for (i = 0; i < nvals; i++) {
	    if (freqs[i] < 0)
		continue;
	    if (low1 > freqs[i]) 
		low2 = low1, ind2 = ind1, low1 = freqs[i], ind1 = i;
	    else if (low2 > freqs[i])
		low2 = freqs[i], ind2 = i;
	}
	if (low2 == INT_MAX)
	    break;

	//fprintf(stderr, "Merge ind %d (%d), %d (%d) = %d+%d, => %d=%d\n",
	//	ind1, vals[ind1], ind2, vals[ind2], low1, low2,
	//	nvals, low1+low2);

	freqs[nvals] = low1 + low2;
	codes[ind1] = nvals;
	codes[ind2] = nvals;
	freqs[ind1] *= -1;
	freqs[ind2] *= -1;
	nvals++;
    }
    nvals = nvals/2+1;

    for (i = 0; i < nvals; i++) {
	int code_len = 0;
	for (k = codes[i]; k; k = codes[k])
	    code_len++;
	codes[i] = code_len;
	freqs[i] *= -1;
	//fprintf(stderr, "%d / %d => %d\n", vals[i], freqs[i], codes[i]);
    }

    for (bits = i = 0; i < nvals; i++) {
	bits += freqs[i] * codes[i];
    }
    if (fd->verbose > 1)
	fprintf(stderr, "HUFFMAN = %d\n", bits);
    if (best_size >= bits)
	best_size = bits, best_encoding = E_HUFFMAN;
    free(codes);

    free(vals);
    free(freqs);

    return best_encoding;
}